

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cc
# Opt level: O1

bool re2c::matches(Span *b1,uint32_t n1,State *s1,Span *b2,uint32_t n2,State *s2)

{
  Span *pSVar1;
  Span *pSVar2;
  Span *pSVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  
  pSVar2 = b1 + n1;
  pSVar3 = b2 + n2;
  uVar4 = 0;
  uVar5 = 0;
  do {
    if ((b1 < pSVar2) && (b1->to != s1)) {
      do {
        pSVar1 = b1;
        b1 = pSVar1 + 1;
        if (pSVar2 <= b1) break;
      } while (pSVar1[1].to != s1);
      uVar4 = pSVar1->ub;
    }
    if ((b2 < pSVar3) && (b2->to != s2)) {
      do {
        pSVar1 = b2;
        b2 = pSVar1 + 1;
        if (pSVar3 <= b2) break;
      } while (pSVar1[1].to != s2);
      uVar5 = pSVar1->ub;
    }
    if (b1 == pSVar2) {
      return b2 == pSVar3;
    }
    if (b2 == pSVar3) {
      return false;
    }
    if (uVar4 != uVar5) {
      return false;
    }
    if (b1->ub != b2->ub) {
      return false;
    }
    b1 = b1 + 1;
    b2 = b2 + 1;
  } while( true );
}

Assistant:

bool matches(const Span * b1, uint32_t n1, const State * s1, const Span * b2, uint32_t n2, const State * s2)
{
	const Span * e1 = &b1[n1];
	uint32_t lb1 = 0;
	const Span * e2 = &b2[n2];
	uint32_t lb2 = 0;

	for (;;)
	{
		for (; b1 < e1 && b1->to != s1; ++b1)
		{
			lb1 = b1->ub;
		}
		for (; b2 < e2 && b2->to != s2; ++b2)
		{
			lb2 = b2->ub;
		}
		if (b1 == e1)
		{
			return b2 == e2;
		}
		if (b2 == e2)
		{
			return false;
		}
		if (lb1 != lb2 || b1->ub != b2->ub)
		{
			return false;
		}
		++b1;
		++b2;
	}
}